

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCRegisterInfo.c
# Opt level: O2

uint MCRegisterInfo_getSubReg(MCRegisterInfo *RI,uint Reg,uint Idx)

{
  ushort uVar1;
  ulong uVar2;
  ushort *puVar3;
  ushort *puVar4;
  
  uVar2 = (ulong)Reg;
  if (RI->DiffLists == (MCPhysReg *)0x0) {
    puVar4 = (ushort *)0x0;
  }
  else {
    puVar3 = RI->DiffLists + RI->Desc[Reg].SubRegs;
    uVar1 = *puVar3;
    Reg = Reg + uVar1;
    puVar4 = (ushort *)0x0;
    if (uVar1 != 0) {
      puVar4 = puVar3 + 1;
    }
  }
  puVar3 = RI->SubRegIndices + RI->Desc[uVar2].SubRegIndices;
  while( true ) {
    if (puVar4 == (ushort *)0x0) {
      return 0;
    }
    if (*puVar3 == Idx) break;
    uVar1 = *puVar4;
    if (uVar1 == 0) {
      puVar4 = (ushort *)0x0;
    }
    else {
      puVar4 = puVar4 + 1;
    }
    Reg = uVar1 + Reg;
    puVar3 = puVar3 + 1;
  }
  return Reg & 0xffff;
}

Assistant:

unsigned MCRegisterInfo_getSubReg(MCRegisterInfo *RI, unsigned Reg, unsigned Idx)
{
	DiffListIterator iter;
	uint16_t *SRI = RI->SubRegIndices + RI->Desc[Reg].SubRegIndices;

	DiffListIterator_init(&iter, (MCPhysReg)Reg, RI->DiffLists + RI->Desc[Reg].SubRegs);
	DiffListIterator_next(&iter);

	while(DiffListIterator_isValid(&iter)) {
		if (*SRI == Idx)
			return DiffListIterator_getVal(&iter);
		DiffListIterator_next(&iter);
		++SRI;
	}

	return 0;
}